

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

void NaPetriNet::user_break(int signum)

{
  sigaction sa_old;
  sigaction sa;
  
  bUserBreak = true;
  sa.__sigaction_handler.sa_handler = user_break;
  sa.sa_flags = -0x80000000;
  sigaction(2,(sigaction *)&sa,(sigaction *)&sa_old);
  sigaction(0xf,(sigaction *)&sa,(sigaction *)&sa_old);
  sigaction(3,(sigaction *)&sa,(sigaction *)&sa_old);
  return;
}

Assistant:

void
NaPetriNet::user_break (int signum)
{
    bUserBreak = true;

    // Repeat register the signal handler oncve again
    struct sigaction	sa, sa_old;
    sa.sa_handler = user_break;
    sa.sa_flags = SA_ONESHOT;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
}